

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::protos::gen::BeginFrameObserverState::~BeginFrameObserverState
          (BeginFrameObserverState *this)

{
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__BeginFrameObserverState_00407df0;
  ::std::__cxx11::string::~string((string *)&this->unknown_fields_);
  std::
  unique_ptr<perfetto::protos::gen::BeginFrameArgs,_std::default_delete<perfetto::protos::gen::BeginFrameArgs>_>
  ::~unique_ptr(&(this->last_begin_frame_args_).ptr_);
  return;
}

Assistant:

BeginFrameObserverState::~BeginFrameObserverState() = default;